

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O3

void R_Init(void)

{
  addterm(R_Shutdown,"R_Shutdown");
  (*StartScreen->_vptr_FStartupScreen[2])();
  V_InitFonts();
  (*StartScreen->_vptr_FStartupScreen[2])();
  R_InitTranslationTables();
  setsizeneeded = true;
  setblocks = screenblocks.Value;
  (*Renderer->_vptr_FRenderer[0xf])();
  return;
}

Assistant:

void R_Init ()
{
	atterm (R_Shutdown);

	StartScreen->Progress();
	V_InitFonts();
	StartScreen->Progress();
	// Colormap init moved back to InitPalette()
	//R_InitColormaps ();
	//StartScreen->Progress();

	R_InitTranslationTables ();
	R_SetViewSize (screenblocks);
	Renderer->Init();
}